

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_2::ViewPortTestCase::test(ViewPortTestCase *this)

{
  CallLogWrapper *this_00;
  StateVerifier *pSVar1;
  TestContext *pTVar2;
  uint uVar3;
  GLfloat __x;
  bool bVar4;
  deUint32 dVar5;
  uint width;
  int height;
  RenderTarget *pRVar6;
  _func_int **pp_Var7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint y;
  int iVar11;
  bool bVar12;
  float fVar13;
  GLfloat viewportBoundsRange [2];
  GLint maxViewportDimensions [2];
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,0xabcdef);
  maxViewportDimensions[0] = 0;
  maxViewportDimensions[1] = 0;
  viewportBoundsRange[0] = 0.0;
  viewportBoundsRange[1] = 0.0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0xd3a,maxViewportDimensions);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_OES_viewport_array");
  if (!bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_NV_viewport_array");
    if (!bVar4) {
      bVar4 = false;
      goto LAB_010c111a;
    }
  }
  glu::CallLogWrapper::glGetFloatv(this_00,0x825d,viewportBoundsRange);
  bVar4 = true;
LAB_010c111a:
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar6 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar8 = pRVar6->m_width;
  pRVar6 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  (*pSVar1->_vptr_StateVerifier[3])(pSVar1,pTVar2,0xba2,0,0,(ulong)uVar8,pRVar6->m_height);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar11 = 0x78;
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    dVar5 = deRandom_getUint32(&rnd.m_rnd);
    uVar8 = dVar5 % 0x1f401 - 64000;
    dVar5 = deRandom_getUint32(&rnd.m_rnd);
    y = dVar5 % 0x1f401 - 64000;
    width = de::Random::getInt((Random *)&rnd.m_rnd,0,maxViewportDimensions[0]);
    height = de::Random::getInt((Random *)&rnd.m_rnd,0,maxViewportDimensions[1]);
    glu::CallLogWrapper::glViewport(this_00,uVar8,y,width,height);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pSVar1 = this->m_verifier;
    if (bVar4) {
      __x = viewportBoundsRange[1];
      fVar13 = floorf(viewportBoundsRange[0]);
      uVar10 = (uint)fVar13;
      fVar13 = floorf(__x);
      uVar9 = (uint)fVar13;
      uVar3 = uVar9;
      if ((int)uVar8 < (int)uVar9) {
        uVar3 = uVar8;
      }
      bVar12 = (int)uVar8 < (int)uVar10;
      uVar8 = uVar3;
      if (bVar12) {
        uVar8 = uVar10;
      }
      if ((int)y < (int)uVar9) {
        uVar9 = y;
      }
      bVar12 = (int)y < (int)uVar10;
      y = uVar9;
      if (bVar12) {
        y = uVar10;
      }
      pp_Var7 = pSVar1->_vptr_StateVerifier;
    }
    else {
      pp_Var7 = pSVar1->_vptr_StateVerifier;
    }
    (*pp_Var7[3])(pSVar1,pTVar2,0xba2,(ulong)uVar8,(ulong)y,(ulong)width,height);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLint maxViewportDimensions[2] = {0};
		GLfloat viewportBoundsRange[2] = {0.0f};
		GLboolean hasViewportArray = false;
		glGetIntegerv(GL_MAX_VIEWPORT_DIMS, maxViewportDimensions);
		hasViewportArray = m_context.getContextInfo().isExtensionSupported("GL_OES_viewport_array") ||
						   m_context.getContextInfo().isExtensionSupported("GL_NV_viewport_array");
		if (hasViewportArray)
		{
			glGetFloatv(GL_VIEWPORT_BOUNDS_RANGE, viewportBoundsRange);
		}

		// verify initial value of first two values
		m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT, 0, 0, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			GLint x			= rnd.getInt(-64000, 64000);
			GLint y			= rnd.getInt(-64000, 64000);
			GLsizei width	= rnd.getInt(0, maxViewportDimensions[0]);
			GLsizei height	= rnd.getInt(0, maxViewportDimensions[1]);

			glViewport(x, y, width, height);

			if (hasViewportArray)
			{
				m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT,
										   de::clamp(x, deFloorFloatToInt32(viewportBoundsRange[0]), deFloorFloatToInt32(viewportBoundsRange[1])),
										   de::clamp(y, deFloorFloatToInt32(viewportBoundsRange[0]), deFloorFloatToInt32(viewportBoundsRange[1])),
										   width, height);
			}
			else
			{
				m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT, x, y, width, height);
			}

			expectError(GL_NO_ERROR);
		}
	}